

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Man.c
# Opt level: O2

void Llb_ManStop(Llb_Man_t *p)

{
  Vec_Ptr_t *p_00;
  Llb_Grp_t *p_01;
  DdNode *n;
  int iVar1;
  DdManager *pDVar2;
  
  if (p->pMatrix != (Llb_Mtr_t *)0x0) {
    Llb_MtrFree(p->pMatrix);
  }
  for (iVar1 = 0; p_00 = p->vGroups, iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
    p_01 = (Llb_Grp_t *)Vec_PtrEntry(p_00,iVar1);
    Llb_ManGroupStop(p_01);
  }
  if (p->dd != (DdManager *)0x0) {
    Extra_StopManager(p->dd);
  }
  pDVar2 = p->ddG;
  if (pDVar2 != (DdManager *)0x0) {
    if (pDVar2->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(pDVar2,pDVar2->bFunc);
      pDVar2 = p->ddG;
    }
    Extra_StopManager(pDVar2);
  }
  pDVar2 = p->ddR;
  if (pDVar2 != (DdManager *)0x0) {
    if (pDVar2->bFunc != (DdNode *)0x0) {
      Cudd_RecursiveDeref(pDVar2,pDVar2->bFunc);
    }
    for (iVar1 = 0; iVar1 < p->vRings->nSize; iVar1 = iVar1 + 1) {
      n = (DdNode *)Vec_PtrEntry(p->vRings,iVar1);
      Cudd_RecursiveDeref(p->ddR,n);
    }
    Extra_StopManager(p->ddR);
  }
  Aig_ManStop(p->pAig);
  Vec_PtrFreeP(&p->vGroups);
  Vec_IntFreeP(&p->vVar2Obj);
  Vec_IntFreeP(&p->vObj2Var);
  Vec_IntFreeP(&p->vVarBegs);
  Vec_IntFreeP(&p->vVarEnds);
  Vec_PtrFreeP(&p->vRings);
  Vec_IntFreeP(&p->vNs2Glo);
  Vec_IntFreeP(&p->vCs2Glo);
  Vec_IntFreeP(&p->vGlo2Cs);
  Vec_IntFreeP(&p->vGlo2Ns);
  free(p);
  return;
}

Assistant:

void Llb_ManStop( Llb_Man_t * p )
{
    Llb_Grp_t * pGrp;
    DdNode * bTemp;
    int i;

//    Vec_IntFreeP( &p->vMem );
//    Vec_PtrFreeP( &p->vTops );
//    Vec_PtrFreeP( &p->vBots );
//    Vec_VecFreeP( (Vec_Vec_t **)&p->vCuts );

    if ( p->pMatrix )
        Llb_MtrFree( p->pMatrix );
    Vec_PtrForEachEntry( Llb_Grp_t *, p->vGroups, pGrp, i )
        Llb_ManGroupStop( pGrp );
    if ( p->dd )
    {
//        printf( "Manager dd\n" );
        Extra_StopManager( p->dd );
    }
    if ( p->ddG )
    {
//        printf( "Manager ddG\n" );
        if ( p->ddG->bFunc )
            Cudd_RecursiveDeref( p->ddG, p->ddG->bFunc ); 
        Extra_StopManager( p->ddG );
    }
    if ( p->ddR )
    {
//        printf( "Manager ddR\n" );
        if ( p->ddR->bFunc )
            Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc ); 
        Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
            Cudd_RecursiveDeref( p->ddR, bTemp );
        Extra_StopManager( p->ddR );
    }
    Aig_ManStop( p->pAig );
    Vec_PtrFreeP( &p->vGroups );
    Vec_IntFreeP( &p->vVar2Obj );
    Vec_IntFreeP( &p->vObj2Var );
    Vec_IntFreeP( &p->vVarBegs );
    Vec_IntFreeP( &p->vVarEnds );
    Vec_PtrFreeP( &p->vRings  );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
//    Vec_IntFreeP( &p->vHints );
    ABC_FREE( p );
}